

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

DestructuringDecl * __thiscall SQASTReader::readDestructuringDecl(SQASTReader *this)

{
  Arena *this_00;
  DestructuringDecl *g;
  int iVar1;
  Chunk *pCVar2;
  Expr *pEVar3;
  
  this_00 = this->astArena;
  pCVar2 = Arena::findChunk(this_00,0x48);
  g = (DestructuringDecl *)pCVar2->_ptr;
  pCVar2->_ptr = (uint8_t *)(g + 1);
  (g->super_DeclGroup).super_Decl.super_Statement.super_Node._op = TO_DESTRUCTURE;
  (g->super_DeclGroup).super_Decl.super_Statement.super_Node._coordinates.lineStart = -1;
  (g->super_DeclGroup).super_Decl.super_Statement.super_Node._coordinates.columnStart = -1;
  (g->super_DeclGroup).super_Decl.super_Statement.super_Node._coordinates.lineEnd = -1;
  (g->super_DeclGroup).super_Decl.super_Statement.super_Node._coordinates.columnEnd = -1;
  (g->super_DeclGroup)._decls._arena = this_00;
  (g->super_DeclGroup)._decls._vals = (VarDecl **)0x0;
  (g->super_DeclGroup)._decls._size = 0;
  (g->super_DeclGroup)._decls._allocated = 0;
  (g->super_DeclGroup).super_Decl.super_Statement.super_Node.super_ArenaObj._vptr_ArenaObj =
       (_func_int **)&PTR__ArenaObj_001a4ea8;
  g->_expr = (Expr *)0x0;
  g->_dt_type = DT_TABLE;
  readDeclGroupBody(this,(DeclGroup *)g);
  iVar1 = (**this->stream->_vptr_InputStream)();
  g->_dt_type = (int)(char)iVar1;
  pEVar3 = readExpression(this);
  g->_expr = pEVar3;
  iVar1 = (pEVar3->super_Node)._coordinates.columnEnd;
  (g->super_DeclGroup).super_Decl.super_Statement.super_Node._coordinates.lineEnd =
       (pEVar3->super_Node)._coordinates.lineEnd;
  (g->super_DeclGroup).super_Decl.super_Statement.super_Node._coordinates.columnEnd = iVar1;
  return g;
}

Assistant:

DestructuringDecl *SQASTReader::readDestructuringDecl() {
  DestructuringDecl *g = newNode<DestructuringDecl>(astArena, DT_TABLE);

  readDeclGroupBody(g);

  enum DestructuringType type = (enum DestructuringType)stream->readInt8();

  g->setType(type);
  g->setExpression(readExpression());

  return g;
}